

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall l2r_l2_svc_fun::subXTv(l2r_l2_svc_fun *this,double *v,double *XTv)

{
  feature_node **ppfVar1;
  long lVar2;
  
  ppfVar1 = this->prob->x;
  Reduce_Vectors::init(this->reduce_vectors,(EVP_PKEY_CTX *)v);
  for (lVar2 = 0; lVar2 < this->sizeI; lVar2 = lVar2 + 1) {
    Reduce_Vectors::sum_scale_x(this->reduce_vectors,v[lVar2],ppfVar1[this->I[lVar2]]);
  }
  Reduce_Vectors::reduce_sum(this->reduce_vectors,XTv);
  return;
}

Assistant:

void l2r_l2_svc_fun::subXTv(double *v, double *XTv)
{
	int i;
	feature_node **x=prob->x;

	reduce_vectors->init();

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<sizeI;i++)
		reduce_vectors->sum_scale_x(v[i], x[I[i]]);

	reduce_vectors->reduce_sum(XTv);
}